

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O2

UChar32 __thiscall
icu_63::FCDUTF8CollationIterator::nextCodePoint
          (FCDUTF8CollationIterator *this,UErrorCode *errorCode)

{
  int32_t *piVar1;
  byte bVar2;
  short sVar3;
  State SVar4;
  int offset;
  uint8_t *puVar5;
  UBool UVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  
  do {
    while (SVar4 = this->state, SVar4 == IN_NORMALIZED) {
      sVar3 = (this->normalized).fUnion.fStackFields.fLengthAndFlags;
      if (sVar3 < 0) {
        iVar8 = (this->normalized).fUnion.fFields.fLength;
      }
      else {
        iVar8 = (int)sVar3 >> 5;
      }
      offset = (this->super_UTF8CollationIterator).pos;
      if (offset != iVar8) {
        uVar15 = UnicodeString::char32At(&this->normalized,offset);
        iVar8 = ((this->super_UTF8CollationIterator).pos - (uint)(uVar15 < 0x10000)) + 2;
LAB_00222a54:
        (this->super_UTF8CollationIterator).pos = iVar8;
        return uVar15;
      }
LAB_0022284b:
      switchToForward(this);
    }
    if (SVar4 == IN_FCD_SEGMENT) {
      iVar8 = (this->super_UTF8CollationIterator).pos;
      lVar11 = (long)iVar8;
      if (iVar8 != this->limit) {
        puVar5 = (this->super_UTF8CollationIterator).u8;
        uVar12 = lVar11 + 1;
        (this->super_UTF8CollationIterator).pos = (uint)uVar12;
        bVar2 = puVar5[lVar11];
        uVar15 = (uint)bVar2;
        if (-1 < (char)bVar2) {
          return uVar15;
        }
        uVar14 = (this->super_UTF8CollationIterator).length;
        if ((uint)uVar12 == uVar14) {
          return 0xfffd;
        }
        if (bVar2 < 0xe0) {
          if (bVar2 < 0xc2) {
            return 0xfffd;
          }
          uVar15 = uVar15 & 0x1f;
        }
        else {
          if (bVar2 < 0xf0) {
            uVar15 = uVar15 & 0xf;
            if (((byte)" 000000000000\x1000"[uVar15] >> (puVar5[uVar12] >> 5) & 1) == 0) {
              return 0xfffd;
            }
            bVar13 = puVar5[uVar12] & 0x3f;
          }
          else {
            if (0xf4 < bVar2) {
              return 0xfffd;
            }
            bVar2 = puVar5[uVar12];
            if (((uint)(int)""[bVar2 >> 4] >> (uVar15 - 0xf0 & 0x1f) & 1) == 0) {
              return 0xfffd;
            }
            uVar12 = lVar11 + 2;
            (this->super_UTF8CollationIterator).pos = (uint)uVar12;
            if ((uint)uVar12 == uVar14) {
              return 0xfffd;
            }
            bVar13 = puVar5[uVar12] + 0x80;
            if (0x3f < bVar13) {
              return 0xfffd;
            }
            uVar15 = bVar2 & 0x3f | (uVar15 - 0xf0) * 0x40;
            uVar12 = uVar12 & 0xffffffff;
          }
          uVar7 = (int)uVar12 + 1;
          uVar12 = (ulong)uVar7;
          (this->super_UTF8CollationIterator).pos = uVar7;
          if (uVar7 == uVar14) {
            return 0xfffd;
          }
          uVar15 = (uint)bVar13 | uVar15 << 6;
        }
        if (0x3f < (byte)(puVar5[(int)uVar12] ^ 0x80)) {
          return 0xfffd;
        }
        uVar15 = uVar15 << 6 | puVar5[(int)uVar12] ^ 0x80;
        iVar8 = (int)uVar12 + 1;
        goto LAB_00222a54;
      }
      goto LAB_0022284b;
    }
    if (SVar4 != CHECK_FWD) goto LAB_0022284b;
    uVar14 = (this->super_UTF8CollationIterator).pos;
    lVar11 = (long)(int)uVar14;
    uVar15 = (this->super_UTF8CollationIterator).length;
    uVar7 = 0xffffffff;
    if (uVar14 == uVar15) {
      return -1;
    }
    puVar5 = (this->super_UTF8CollationIterator).u8;
    bVar2 = puVar5[lVar11];
    if (((int)uVar15 < 0) && (bVar2 == 0)) {
      return -1;
    }
    if (-1 < (char)bVar2) {
      uVar15 = (uint)bVar2;
      iVar8 = uVar14 + 1;
      goto LAB_00222a54;
    }
    uVar12 = lVar11 + 1;
    (this->super_UTF8CollationIterator).pos = (uint)uVar12;
    bVar2 = puVar5[lVar11];
    uVar9 = (uint)bVar2;
    uVar14 = uVar9;
    if (((char)bVar2 < '\0') && (uVar14 = 0xfffd, (uint)uVar12 != uVar15)) {
      if (bVar2 < 0xe0) {
        if (0xc1 < bVar2) {
          uVar9 = uVar9 & 0x1f;
LAB_0022297b:
          bVar2 = puVar5[(int)uVar12];
          if ((byte)(bVar2 ^ 0x80) < 0x40) {
            (this->super_UTF8CollationIterator).pos = (int)uVar12 + 1;
            uVar14 = uVar9 << 6 | bVar2 ^ 0x80;
          }
        }
      }
      else if (bVar2 < 0xf0) {
        uVar9 = uVar9 & 0xf;
        if (((byte)" 000000000000\x1000"[uVar9] >> (puVar5[uVar12] >> 5) & 1) != 0) {
          bVar13 = puVar5[uVar12] & 0x3f;
LAB_00222952:
          uVar10 = (int)uVar12 + 1;
          uVar12 = (ulong)uVar10;
          (this->super_UTF8CollationIterator).pos = uVar10;
          if (uVar10 != uVar15) {
            uVar9 = (uint)bVar13 | uVar9 << 6;
            goto LAB_0022297b;
          }
        }
      }
      else if (bVar2 < 0xf5) {
        bVar2 = puVar5[uVar12];
        if (((uint)(int)""[bVar2 >> 4] >> (uVar9 - 0xf0 & 0x1f) & 1) != 0) {
          uVar12 = lVar11 + 2;
          (this->super_UTF8CollationIterator).pos = (uint)uVar12;
          if (((uint)uVar12 != uVar15) && (bVar13 = puVar5[uVar12] + 0x80, bVar13 < 0x40)) {
            uVar9 = bVar2 & 0x3f | (uVar9 - 0xf0) * 0x40;
            uVar12 = uVar12 & 0xffffffff;
            goto LAB_00222952;
          }
        }
      }
    }
    uVar15 = (uVar14 >> 10) + 0xd7c0 & 0xffff;
    if ((int)uVar14 < 0x10000) {
      uVar15 = uVar14;
    }
    UVar6 = CollationFCD::hasTccc(uVar15);
    if (UVar6 == '\0') {
      return uVar14;
    }
    if ((uVar14 & 0x1fff01) == 0xf01) {
LAB_0022289b:
      uVar7 = 0xfffffffd;
      if ((0xd7ff < uVar14) && (uVar7 = 0, 0xffefdfff < uVar14 - 0x110000)) {
        uVar7 = uVar14 < 0x10000 | 0xfffffffc;
      }
    }
    else {
      if ((this->super_UTF8CollationIterator).pos == (this->super_UTF8CollationIterator).length) {
        return uVar14;
      }
      UVar6 = nextHasLccc(this);
      if (UVar6 == '\0') {
        return uVar14;
      }
      if ((0x7f < uVar14) && (uVar7 = 0xfffffffe, 0x7ff < uVar14)) goto LAB_0022289b;
    }
    piVar1 = &(this->super_UTF8CollationIterator).pos;
    *piVar1 = *piVar1 + uVar7;
    UVar6 = nextSegment(this,errorCode);
    if (UVar6 == '\0') {
      return -1;
    }
  } while( true );
}

Assistant:

UChar32
FCDUTF8CollationIterator::nextCodePoint(UErrorCode &errorCode) {
    UChar32 c;
    for(;;) {
        if(state == CHECK_FWD) {
            if(pos == length || ((c = u8[pos]) == 0 && length < 0)) {
                return U_SENTINEL;
            }
            if(U8_IS_SINGLE(c)) {
                ++pos;
                return c;
            }
            U8_NEXT_OR_FFFD(u8, pos, length, c);
            if(CollationFCD::hasTccc(c <= 0xffff ? c : U16_LEAD(c)) &&
                    (CollationFCD::maybeTibetanCompositeVowel(c) ||
                        (pos != length && nextHasLccc()))) {
                // c is not FCD-inert, therefore it is not U+FFFD and it has a valid byte sequence
                // and we can use U8_LENGTH() rather than a previous-position variable.
                pos -= U8_LENGTH(c);
                if(!nextSegment(errorCode)) {
                    return U_SENTINEL;
                }
                continue;
            }
            return c;
        } else if(state == IN_FCD_SEGMENT && pos != limit) {
            U8_NEXT_OR_FFFD(u8, pos, length, c);
            return c;
        } else if(state == IN_NORMALIZED && pos != normalized.length()) {
            c = normalized.char32At(pos);
            pos += U16_LENGTH(c);
            return c;
        } else {
            switchToForward();
        }
    }
}